

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.cpp
# Opt level: O2

vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
* __thiscall
rlottie::internal::model::Composition::layerInfoList_abi_cxx11_
          (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
           *__return_storage_ptr__,Composition *this)

{
  Layer *pLVar1;
  pointer ppOVar2;
  Object *pOVar3;
  pointer ppOVar4;
  Object *local_28;
  
  pLVar1 = this->mRootLayer;
  if (pLVar1 != (Layer *)0x0) {
    ppOVar4 = (pLVar1->super_Group).mChildren.
              super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppOVar2 = (pLVar1->super_Group).mChildren.
              super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppOVar4 != ppOVar2) {
      (__return_storage_ptr__->
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
      ::reserve(__return_storage_ptr__,(long)ppOVar2 - (long)ppOVar4 >> 3);
      ppOVar2 = (this->mRootLayer->super_Group).mChildren.
                super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppOVar4 = (this->mRootLayer->super_Group).mChildren.
                     super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppOVar4 != ppOVar2;
          ppOVar4 = ppOVar4 + 1) {
        pOVar3 = *ppOVar4;
        local_28 = pOVar3;
        if ((undefined1  [16])
            ((undefined1  [16])pOVar3->field_0 & (undefined1  [16])0x400000000000000) ==
            (undefined1  [16])0x0) {
          local_28 = (Object *)(pOVar3->field_0).mPtr;
        }
        std::
        vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>
        ::emplace_back<char_const*,int&,int&>
                  ((vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>
                    *)__return_storage_ptr__,(char **)&local_28,(int *)(pOVar3 + 5),
                   (int *)(pOVar3[5].field_0.mData._buffer + 4));
      }
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<LayerInfo> model::Composition::layerInfoList() const
{
    if (!mRootLayer || mRootLayer->mChildren.empty()) return {};

    std::vector<LayerInfo> result;

    result.reserve(mRootLayer->mChildren.size());

    for (auto it : mRootLayer->mChildren) {
        auto layer = static_cast<model::Layer *>(it);
        result.emplace_back(layer->name(), layer->mInFrame, layer->mOutFrame);
    }

    return result;
}